

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O3

void __thiscall wasm::SubTypes::note(SubTypes *this,HeapType type)

{
  iterator __position;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *this_00;
  optional<wasm::HeapType> oVar1;
  _Storage<wasm::HeapType,_true> local_28;
  optional<wasm::HeapType> super;
  HeapType type_local;
  
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = type.id;
  oVar1 = HeapType::getDeclaredSuperType
                    ((HeapType *)
                     &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_engaged);
  local_28 = oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       oVar1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    this_00 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
              std::__detail::
              _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->typeSubTypes,&local_28._M_value);
    __position._M_current = *(HeapType **)(this_00 + 8);
    if (__position._M_current == *(HeapType **)(this_00 + 0x10)) {
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                (this_00,__position,
                 (HeapType *)
                 &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_engaged);
    }
    else {
      (__position._M_current)->id =
           super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._8_8_;
      *(HeapType **)(this_00 + 8) = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void note(HeapType type) {
    if (auto super = type.getDeclaredSuperType()) {
      typeSubTypes[*super].push_back(type);
    }
  }